

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

void __thiscall
embree::DielectricMaterial::DielectricMaterial
          (DielectricMaterial *this,Vec3fa *transmissionOutside,Vec3fa *transmissionInside,
          float etaOutside,float etaInside)

{
  undefined8 uVar1;
  allocator local_49;
  float local_48;
  float local_44;
  string local_40;
  
  local_48 = etaOutside;
  local_44 = etaInside;
  std::__cxx11::string::string((string *)&local_40,"",&local_49);
  SceneGraph::MaterialNode::MaterialNode(&this->super_MaterialNode,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002a9db8;
  (this->base).type = 4;
  uVar1 = *(undefined8 *)((long)&transmissionOutside->field_0 + 8);
  *(undefined8 *)&(this->transmissionOutside).field_0 = *(undefined8 *)&transmissionOutside->field_0
  ;
  *(undefined8 *)((long)&(this->transmissionOutside).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&transmissionInside->field_0 + 8);
  *(undefined8 *)&(this->transmissionInside).field_0 = *(undefined8 *)&transmissionInside->field_0;
  *(undefined8 *)((long)&(this->transmissionInside).field_0 + 8) = uVar1;
  this->etaOutside = local_48;
  this->etaInside = local_44;
  return;
}

Assistant:

DielectricMaterial (const Vec3fa& transmissionOutside, const Vec3fa& transmissionInside, const float etaOutside, const float etaInside)
      : base(MATERIAL_DIELECTRIC), transmissionOutside(transmissionOutside), transmissionInside(transmissionInside), etaOutside(etaOutside), etaInside(etaInside) {}